

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall
ImGuiIO::SetKeyEventNativeData
          (ImGuiIO *this,ImGuiKey key,int native_keycode,int native_scancode,int native_legacy_index
          )

{
  if (key != ImGuiKey_KeysData_OFFSET) {
    if (native_legacy_index != -1) {
      native_keycode = native_legacy_index;
    }
    if ((uint)native_keycode < 0x200) {
      this->KeyMap[(uint)native_keycode] = key;
      this->KeyMap[(int)key] = native_keycode;
    }
  }
  return;
}

Assistant:

void ImGuiIO::SetKeyEventNativeData(ImGuiKey key, int native_keycode, int native_scancode, int native_legacy_index)
{
    if (key == ImGuiKey_None)
        return;
    IM_ASSERT(ImGui::IsNamedKey(key)); // >= 512
    IM_ASSERT(native_legacy_index == -1 || ImGui::IsLegacyKey((ImGuiKey)native_legacy_index)); // >= 0 && <= 511
    IM_UNUSED(native_keycode);  // Yet unused
    IM_UNUSED(native_scancode); // Yet unused

    // Build native->imgui map so old user code can still call key functions with native 0..511 values.
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    const int legacy_key = (native_legacy_index != -1) ? native_legacy_index : native_keycode;
    if (!ImGui::IsLegacyKey((ImGuiKey)legacy_key))
        return;
    KeyMap[legacy_key] = key;
    KeyMap[key] = legacy_key;
#else
    IM_UNUSED(key);
    IM_UNUSED(native_legacy_index);
#endif
}